

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mbedtls_wrapper.cpp
# Opt level: O0

mbedtls_cipher_info_t * __thiscall
duckdb_mbedtls::MbedTlsWrapper::AESStateMBEDTLS::GetCipher(AESStateMBEDTLS *this,size_t key_len)

{
  runtime_error *prVar1;
  undefined8 uVar2;
  long in_RSI;
  long in_RDI;
  undefined4 in_stack_ffffffffffffffb4;
  int params;
  string *in_stack_ffffffffffffffb8;
  InternalException *in_stack_ffffffffffffffc0;
  mbedtls_cipher_info_t *local_8;
  
  if (*(int *)(in_RDI + 0xc) == 0) {
    if (in_RSI == 0x10) {
      local_8 = mbedtls_cipher_info_from_type(MBEDTLS_CIPHER_AES_128_GCM);
    }
    else if (in_RSI == 0x18) {
      local_8 = mbedtls_cipher_info_from_type(MBEDTLS_CIPHER_AES_192_GCM);
    }
    else {
      if (in_RSI != 0x20) {
        prVar1 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::runtime_error::runtime_error(prVar1,"Invalid AES key length");
        __cxa_throw(prVar1,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
      local_8 = mbedtls_cipher_info_from_type(MBEDTLS_CIPHER_AES_256_GCM);
    }
  }
  else {
    if (*(int *)(in_RDI + 0xc) != 1) {
      params = CONCAT13(SUB41((uint)in_stack_ffffffffffffffb4 >> 0x18,0),
                        CONCAT12(1,(short)in_stack_ffffffffffffffb4));
      uVar2 = __cxa_allocate_exception(0x10);
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                ((string *)&stack0xffffffffffffffb8,"Invalid Encryption/Decryption Cipher: %d",
                 (allocator *)&stack0xffffffffffffffb7);
      duckdb::InternalException::InternalException<int>
                (in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8,params);
      __cxa_throw(uVar2,&duckdb::InternalException::typeinfo,
                  duckdb::InternalException::~InternalException);
    }
    if (in_RSI == 0x10) {
      local_8 = mbedtls_cipher_info_from_type(MBEDTLS_CIPHER_AES_128_CTR);
    }
    else if (in_RSI == 0x18) {
      local_8 = mbedtls_cipher_info_from_type(MBEDTLS_CIPHER_AES_192_CTR);
    }
    else {
      if (in_RSI != 0x20) {
        prVar1 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::runtime_error::runtime_error(prVar1,"Invalid AES key length");
        __cxa_throw(prVar1,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
      local_8 = mbedtls_cipher_info_from_type(MBEDTLS_CIPHER_AES_256_CTR);
    }
  }
  return local_8;
}

Assistant:

const mbedtls_cipher_info_t *MbedTlsWrapper::AESStateMBEDTLS::GetCipher(size_t key_len){

	switch(cipher){
		case GCM:
		    switch (key_len) {
		    case 16:
			    return mbedtls_cipher_info_from_type(MBEDTLS_CIPHER_AES_128_GCM);
		    case 24:
			    return mbedtls_cipher_info_from_type(MBEDTLS_CIPHER_AES_192_GCM);
		    case 32:
			    return mbedtls_cipher_info_from_type(MBEDTLS_CIPHER_AES_256_GCM);
		    default:
			    throw runtime_error("Invalid AES key length");
		    }

		case CTR:
		    switch (key_len) {
		    case 16:
			    return mbedtls_cipher_info_from_type(MBEDTLS_CIPHER_AES_128_CTR);
		    case 24:
			    return mbedtls_cipher_info_from_type(MBEDTLS_CIPHER_AES_192_CTR);
		    case 32:
			    return mbedtls_cipher_info_from_type(MBEDTLS_CIPHER_AES_256_CTR);
		    default:
			    throw runtime_error("Invalid AES key length");
		    }

		default:
			throw duckdb::InternalException("Invalid Encryption/Decryption Cipher: %d", static_cast<int>(cipher));
	}
}